

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverApi.c
# Opt level: O2

Msat_Solver_t *
Msat_SolverAlloc(int nVarsAlloc,double dClaInc,double dClaDecay,double dVarInc,double dVarDecay,
                int fVerbose)

{
  size_t __size;
  uint uVar1;
  Msat_Solver_t *pSat;
  Msat_ClauseVec_t *pMVar2;
  double *pdVar3;
  float *pfVar4;
  int *piVar5;
  int *piVar6;
  Msat_Order_t *pMVar7;
  Msat_ClauseVec_t **ppMVar8;
  Msat_Queue_t *pMVar9;
  Msat_IntVec_t *pMVar10;
  Msat_Clause_t **ppMVar11;
  Msat_MmStep_t *pMVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  
  pSat = (Msat_Solver_t *)calloc(1,0x148);
  pSat->nVarsAlloc = nVarsAlloc;
  pMVar2 = Msat_ClauseVecAlloc(0x200);
  pSat->vClauses = pMVar2;
  pMVar2 = Msat_ClauseVecAlloc(0x200);
  pSat->vLearned = pMVar2;
  pSat->dClaInc = dClaInc;
  pSat->dClaDecay = dClaDecay;
  pSat->dVarInc = dVarInc;
  pSat->dVarDecay = dVarDecay;
  pdVar3 = (double *)malloc((long)nVarsAlloc * 8);
  pSat->pdActivity = pdVar3;
  __size = (long)nVarsAlloc * 4;
  pfVar4 = (float *)malloc(__size);
  pSat->pFactors = pfVar4;
  uVar13 = 0;
  uVar15 = (ulong)(uint)nVarsAlloc;
  if (nVarsAlloc < 1) {
    uVar15 = uVar13;
  }
  for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
    pdVar3[uVar13] = 0.0;
    pfVar4[uVar13] = 1.0;
  }
  piVar5 = (int *)malloc(__size);
  pSat->pAssigns = piVar5;
  piVar6 = (int *)malloc(__size);
  pSat->pModel = piVar6;
  for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
    piVar5[uVar13] = -1;
  }
  pMVar7 = Msat_OrderAlloc(pSat);
  pSat->pOrder = pMVar7;
  uVar15 = (ulong)pSat->nVarsAlloc;
  ppMVar8 = (Msat_ClauseVec_t **)malloc(uVar15 << 4);
  pSat->pvWatched = ppMVar8;
  for (lVar14 = 0; lVar14 < (int)uVar15 * 2; lVar14 = lVar14 + 1) {
    pMVar2 = Msat_ClauseVecAlloc(0x10);
    pSat->pvWatched[lVar14] = pMVar2;
    uVar15 = (ulong)(uint)pSat->nVarsAlloc;
  }
  pMVar9 = Msat_QueueAlloc((int)uVar15);
  pSat->pQueue = pMVar9;
  pMVar10 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vTrail = pMVar10;
  pMVar10 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vTrailLim = pMVar10;
  uVar1 = pSat->nVarsAlloc;
  ppMVar11 = (Msat_Clause_t **)calloc(1,(long)(int)uVar1 * 8);
  pSat->pReasons = ppMVar11;
  piVar5 = (int *)malloc((long)(int)uVar1 << 2);
  pSat->pLevel = piVar5;
  uVar15 = 0;
  uVar13 = 0;
  if (0 < (int)uVar1) {
    uVar13 = (ulong)uVar1;
  }
  for (; uVar13 != uVar15; uVar15 = uVar15 + 1) {
    piVar5[uVar15] = -1;
  }
  pSat->dRandSeed = 91648253.0;
  pSat->fVerbose = fVerbose;
  pSat->dProgress = 0.0;
  pMVar12 = Msat_MmStepStart(10);
  pSat->pMem = pMVar12;
  pMVar10 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vConeVars = pMVar10;
  pMVar2 = Msat_ClauseVecAlloc(pSat->nVarsAlloc);
  pSat->vAdjacents = pMVar2;
  for (iVar16 = 0; iVar16 < pSat->nVarsAlloc; iVar16 = iVar16 + 1) {
    pMVar2 = pSat->vAdjacents;
    pMVar10 = Msat_IntVecAlloc(5);
    Msat_ClauseVecPush(pMVar2,(Msat_Clause_t *)pMVar10);
  }
  pMVar10 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vVarsUsed = pMVar10;
  Msat_IntVecFill(pMVar10,pSat->nVarsAlloc,1);
  iVar16 = pSat->nVarsAlloc;
  piVar5 = (int *)calloc(1,(long)iVar16 << 2);
  pSat->pSeen = piVar5;
  pSat->nSeenId = 1;
  pMVar10 = Msat_IntVecAlloc(iVar16);
  pSat->vReason = pMVar10;
  pMVar10 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vTemp = pMVar10;
  return pSat;
}

Assistant:

Msat_Solver_t * Msat_SolverAlloc( int nVarsAlloc,
    double dClaInc, double dClaDecay, 
    double dVarInc, double dVarDecay, 
    int  fVerbose )
{
    Msat_Solver_t * p;
    int i;

    assert(sizeof(Msat_Lit_t) == sizeof(unsigned));
    assert(sizeof(float)     == sizeof(unsigned));

    p = ABC_ALLOC( Msat_Solver_t, 1 );
    memset( p, 0, sizeof(Msat_Solver_t) );

    p->nVarsAlloc = nVarsAlloc;
    p->nVars     = 0;

    p->nClauses  = 0;
    p->vClauses  = Msat_ClauseVecAlloc( 512 );
    p->vLearned  = Msat_ClauseVecAlloc( 512 );

    p->dClaInc   = dClaInc;
    p->dClaDecay = dClaDecay;
    p->dVarInc   = dVarInc;
    p->dVarDecay = dVarDecay;

    p->pdActivity = ABC_ALLOC( double, p->nVarsAlloc );
    p->pFactors   = ABC_ALLOC( float, p->nVarsAlloc );
    for ( i = 0; i < p->nVarsAlloc; i++ )
    {
        p->pdActivity[i] = 0.0;
        p->pFactors[i]   = 1.0;
    }

    p->pAssigns  = ABC_ALLOC( int, p->nVarsAlloc ); 
    p->pModel    = ABC_ALLOC( int, p->nVarsAlloc ); 
    for ( i = 0; i < p->nVarsAlloc; i++ )
        p->pAssigns[i] = MSAT_VAR_UNASSIGNED;
//    p->pOrder    = Msat_OrderAlloc( p->pAssigns, p->pdActivity, p->nVarsAlloc );
    p->pOrder    = Msat_OrderAlloc( p );

    p->pvWatched = ABC_ALLOC( Msat_ClauseVec_t *, 2 * p->nVarsAlloc );
    for ( i = 0; i < 2 * p->nVarsAlloc; i++ )
        p->pvWatched[i] = Msat_ClauseVecAlloc( 16 );
    p->pQueue    = Msat_QueueAlloc( p->nVarsAlloc );

    p->vTrail    = Msat_IntVecAlloc( p->nVarsAlloc );
    p->vTrailLim = Msat_IntVecAlloc( p->nVarsAlloc );
    p->pReasons  = ABC_ALLOC( Msat_Clause_t *, p->nVarsAlloc );
    memset( p->pReasons, 0, sizeof(Msat_Clause_t *) * p->nVarsAlloc );
    p->pLevel = ABC_ALLOC( int, p->nVarsAlloc );
    for ( i = 0; i < p->nVarsAlloc; i++ )
        p->pLevel[i] = -1;
    p->dRandSeed = 91648253;
    p->fVerbose  = fVerbose;
    p->dProgress = 0.0;
//    p->pModel = Msat_IntVecAlloc( p->nVarsAlloc );
    p->pMem = Msat_MmStepStart( 10 );

    p->vConeVars   = Msat_IntVecAlloc( p->nVarsAlloc ); 
    p->vAdjacents  = Msat_ClauseVecAlloc( p->nVarsAlloc );
    for ( i = 0; i < p->nVarsAlloc; i++ )
        Msat_ClauseVecPush( p->vAdjacents, (Msat_Clause_t *)Msat_IntVecAlloc(5) );
    p->vVarsUsed   = Msat_IntVecAlloc( p->nVarsAlloc ); 
    Msat_IntVecFill( p->vVarsUsed, p->nVarsAlloc, 1 );


    p->pSeen     = ABC_ALLOC( int, p->nVarsAlloc );
    memset( p->pSeen, 0, sizeof(int) * p->nVarsAlloc );
    p->nSeenId   = 1;
    p->vReason   = Msat_IntVecAlloc( p->nVarsAlloc );
    p->vTemp     = Msat_IntVecAlloc( p->nVarsAlloc );
    return p;
}